

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorProto::FileDescriptorProto(FileDescriptorProto *this,Arena *arena)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileDescriptorProto_0046e030;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = arena;
  this->_has_bits_ = (uint32  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  (this->dependency_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->dependency_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->dependency_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->message_type_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->message_type_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->message_type_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->enum_type_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->service_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->service_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->service_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->service_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->extension_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->extension_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->public_dependency_).current_size_ = 0;
  (this->public_dependency_).total_size_ = 0;
  (this->public_dependency_).arena_or_elements_ = arena;
  (this->weak_dependency_).current_size_ = 0;
  (this->weak_dependency_).total_size_ = 0;
  (this->weak_dependency_).arena_or_elements_ = arena;
  if (scc_info_FileDescriptorProto_google_2fprotobuf_2fdescriptor_2eproto.base.visit_status.
      super___atomic_base<int>._M_i != 0) {
    internal::InitSCCImpl(&scc_info_FileDescriptorProto_google_2fprotobuf_2fdescriptor_2eproto.base)
    ;
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->package_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  (this->syntax_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  this->options_ = (FileOptions *)0x0;
  this->source_code_info_ = (SourceCodeInfo *)0x0;
  return;
}

Assistant:

FileDescriptorProto::FileDescriptorProto(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
  _internal_metadata_(arena),
  dependency_(arena),
  message_type_(arena),
  enum_type_(arena),
  service_(arena),
  extension_(arena),
  public_dependency_(arena),
  weak_dependency_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:google.protobuf.FileDescriptorProto)
}